

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_FunctionPointerReturnValue_Test::testBody
          (TEST_MockReturnValueTest_FunctionPointerReturnValue_Test *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  _func_void *p_Var5;
  TestTerminator *pTVar6;
  undefined8 uVar7;
  undefined4 extraout_var_01;
  SimpleString local_d0;
  MockNamedValue local_c0;
  SimpleString local_70;
  SimpleString local_60;
  long *local_50;
  MockActualCall *actual_call;
  SimpleString local_28;
  undefined8 local_18;
  _func_void *ptr;
  TEST_MockReturnValueTest_FunctionPointerReturnValue_Test *this_local;
  
  local_18 = 0x107;
  ptr = (_func_void *)this;
  SimpleString::SimpleString(&local_28,"");
  pMVar3 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&actual_call,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&actual_call);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x118))
            ((long *)CONCAT44(extraout_var,iVar2),local_18);
  SimpleString::~SimpleString((SimpleString *)&actual_call);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  local_50 = (long *)CONCAT44(extraout_var_00,iVar2);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  (**(code **)(*local_50 + 0xa8))();
  p_Var5 = MockNamedValue::getFunctionPointerValue(&local_c0);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,uVar1,p_Var5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2de,pTVar6);
  MockNamedValue::~MockNamedValue(&local_c0);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  uVar7 = (**(code **)(*local_50 + 0x160))();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,uVar1,uVar7,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2df,pTVar6);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_18;
  SimpleString::SimpleString(&local_d0,"");
  pMVar3 = mock(&local_d0,(MockFailureReporter *)0x0);
  iVar2 = (*pMVar3->_vptr_MockSupport[0x20])();
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x14])
            (pUVar4,uVar1,CONCAT44(extraout_var_01,iVar2),0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x2e0,pTVar6);
  SimpleString::~SimpleString(&local_d0);
  return;
}

Assistant:

TEST(MockReturnValueTest, FunctionPointerReturnValue)
{
    void (*ptr)() = (void(*)()) 0x00107;
    mock().expectOneCall("foo").andReturnValue(ptr);
    MockActualCall& actual_call = mock().actualCall("foo");

    FUNCTIONPOINTERS_EQUAL(ptr, actual_call.returnValue().getFunctionPointerValue());
    FUNCTIONPOINTERS_EQUAL(ptr, actual_call.returnFunctionPointerValue());
    FUNCTIONPOINTERS_EQUAL(ptr, mock().functionPointerReturnValue());
}